

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

void Swap4(size_t count,ON__UINT32 *a,ON__UINT32 *b)

{
  ON__UINT32 OVar1;
  ON__UINT32 *pOStack_20;
  ON__UINT32 t;
  ON__UINT32 *b_local;
  ON__UINT32 *a_local;
  size_t count_local;
  
  pOStack_20 = b;
  b_local = a;
  a_local = (ON__UINT32 *)count;
  while (a_local != (ON__UINT32 *)0x0) {
    OVar1 = *b_local;
    *b_local = *pOStack_20;
    *pOStack_20 = OVar1;
    b_local = b_local + 1;
    pOStack_20 = pOStack_20 + 1;
    a_local = (ON__UINT32 *)((long)a_local + -1);
  }
  return;
}

Assistant:

static void Swap4(size_t count, ON__UINT32* a, ON__UINT32* b)
{
  ON__UINT32 t;
  while (count--)
  {
    t = *a;
    *a = *b;
    *b = t;
    a++;
    b++;
  }
}